

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_7b7f9::Player::reset(Player *this)

{
  long lVar1;
  long *in_RDI;
  undefined8 uVar2;
  float fVar3;
  Vec3 VVar4;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  Vec3 local_b8;
  undefined8 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Vec3 local_74;
  undefined8 local_68;
  float local_60;
  undefined8 local_54;
  float local_4c;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  Vec3 local_28;
  undefined8 local_14;
  float local_c;
  
  OpenSteer::SimpleVehicle::reset
            ((SimpleVehicle *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  (**(code **)(*in_RDI + 0xe0))();
  (**(code **)(*in_RDI + 0xf8))();
  (**(code **)(*in_RDI + 0x108))();
  if ((*(byte *)(in_RDI + 0x24) & 1) == 0) {
    OpenSteer::frandom01();
  }
  else {
    OpenSteer::frandom01();
  }
  OpenSteer::frandom01();
  VVar4 = OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>::setPosition
                    ((LocalSpaceMixin<OpenSteer::AbstractVehicle> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  local_28._0_8_ = VVar4._0_8_;
  local_14._0_4_ = local_28.x;
  local_14._4_4_ = local_28.y;
  local_28.z = VVar4.z;
  local_c = local_28.z;
  local_28 = VVar4;
  if (*(int *)((long)in_RDI + 0x124) < 9) {
    if ((*(byte *)(in_RDI + 0x24) & 1) == 0) {
      lVar1 = (long)*(int *)((long)in_RDI + 0x124);
      OpenSteer::Vec3::Vec3
                (&local_74,-*(float *)((anonymous_namespace)::playerPosition + lVar1 * 0xc),
                 *(float *)((anonymous_namespace)::playerPosition + lVar1 * 0xc + 4),
                 *(float *)((anonymous_namespace)::playerPosition + lVar1 * 0xc + 8));
      uVar2 = (**(code **)(*in_RDI + 0x48))(local_74._0_8_);
      in_stack_ffffffffffffff58 = uVar2;
      in_stack_ffffffffffffff60 = local_74.z;
    }
    else {
      fVar3 = *(float *)((anonymous_namespace)::playerPosition +
                        (long)*(int *)((long)in_RDI + 0x124) * 0xc + 8);
      local_48 = *(undefined8 *)
                  ((anonymous_namespace)::playerPosition +
                  (long)*(int *)((long)in_RDI + 0x124) * 0xc);
      local_40 = fVar3;
      local_38 = local_48;
      local_30 = fVar3;
      uVar2 = (**(code **)(*in_RDI + 0x48))(local_48);
      local_74.z = fVar3;
      local_68 = uVar2;
      local_60 = fVar3;
      local_54 = uVar2;
      local_4c = fVar3;
    }
    VVar4.z = local_74.z;
    VVar4.x = (float)(int)uVar2;
    VVar4.y = (float)(int)((ulong)uVar2 >> 0x20);
  }
  fVar3 = VVar4.z;
  local_b8._0_8_ = (**(code **)(*in_RDI + 0x40))();
  local_b8.z = fVar3;
  OpenSteer::Vec3::operator=((Vec3 *)(in_RDI + 0x25),&local_b8);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  clearTrailHistory((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                    0x157c92);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (float)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (int)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void reset (void)
        {
            SimpleVehicle::reset (); // reset the vehicle 
            setSpeed (0.0f);         // speed along Forward direction.
            setMaxForce (3000.7f);      // steering force is clipped to this magnitude
            setMaxSpeed (10);         // velocity is clipped to this magnitude

            // Place me on my part of the field, looking at oponnents goal
            setPosition(b_ImTeamA ? frandom01()*20 : -frandom01()*20, 0, (frandom01()-0.5f)*20);
            if(m_MyID < 9)
                {
                if(b_ImTeamA)
                    setPosition(playerPosition[m_MyID]);
                else
                    setPosition(Vec3(-playerPosition[m_MyID].x, playerPosition[m_MyID].y, playerPosition[m_MyID].z));
                }
            m_home = position();
            clearTrailHistory ();    // prevent long streaks due to teleportation 
            setTrailParameters (10, 60);
        }